

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

bitset_t * bitset_create_with_capacity(size_t size)

{
  uint64_t *puVar1;
  size_t in_RDI;
  bitset_t *bitset;
  bitset_t *local_8;
  
  local_8 = (bitset_t *)roaring_malloc(0x15c3fb);
  if (local_8 == (bitset_t *)0x0) {
    local_8 = (bitset_t *)0x0;
  }
  else {
    local_8->arraysize = in_RDI + 0x3f >> 6;
    local_8->capacity = local_8->arraysize;
    puVar1 = (uint64_t *)roaring_calloc(in_RDI,(size_t)local_8);
    local_8->array = puVar1;
    if (puVar1 == (uint64_t *)0x0) {
      roaring_free((void *)0x15c461);
      local_8 = (bitset_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

bitset_t *bitset_create_with_capacity(size_t size) {
    bitset_t *bitset = NULL;
    /* Allocate the bitset itself. */
    if ((bitset = (bitset_t *)roaring_malloc(sizeof(bitset_t))) == NULL) {
        return NULL;
    }
    bitset->arraysize =
        (size + sizeof(uint64_t) * 8 - 1) / (sizeof(uint64_t) * 8);
    bitset->capacity = bitset->arraysize;
    if ((bitset->array = (uint64_t *)roaring_calloc(
             bitset->arraysize, sizeof(uint64_t))) == NULL) {
        roaring_free(bitset);
        return NULL;
    }
    return bitset;
}